

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

void EncodeIbm858(uint c,StreamOut *out)

{
  uint local_1c;
  int i;
  StreamOut *out_local;
  uint c_local;
  
  if (c < 0x80) {
    PutByte(c,out);
  }
  else {
    for (local_1c = 0x80; (int)local_1c < 0x100; local_1c = local_1c + 1) {
      if (IBM2Unicode[(int)(local_1c - 0x80)] == c) {
        PutByte(local_1c,out);
        return;
      }
    }
  }
  return;
}

Assistant:

static void EncodeIbm858( uint c, StreamOut* out )
{
    if (c < 128)
        PutByte(c, out);
    else
    {
        int i;
        for (i = 128; i < 256; i++)
        {
            if (IBM2Unicode[i - 128] == c)
            {
                PutByte(i, out);
                break;
            }
        }
    }
}